

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createConeZ(BulletEngine *this,aphy_scalar radius,aphy_scalar height)

{
  collision_shape_ptr prVar1;
  btConeShapeZ *this_00;
  collision_shape_ptr local_18;
  
  this_00 = (btConeShapeZ *)btConeShape::operator_new(0x60);
  btConeShapeZ::btConeShapeZ(this_00,radius,height);
  aphy::
  makeObjectWithInterface<aphy::collision_shape,APhyBullet::BulletCollisionShape,btConeShapeZ*>
            ((aphy *)&local_18,this_00);
  prVar1 = local_18;
  local_18 = (collision_shape_ptr)0x0;
  aphy::ref<aphy::collision_shape>::~ref((ref<aphy::collision_shape> *)&local_18);
  return prVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createConeZ(aphy_scalar radius, aphy_scalar height)
{
    return makeObject<BulletCollisionShape> (
        new btConeShapeZ(radius, height)
    ).disown();
}